

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::TrimAndCut
          (double_conversion *this,Vector<const_char> buffer,int exponent,char *buffer_copy_space,
          int space_size,Vector<const_char> *trimmed,int *updated_exponent)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_0000008c;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> VVar3;
  Vector<const_char> local_b8;
  double_conversion *local_a8;
  undefined8 local_a0;
  double_conversion *local_98;
  uint local_90;
  double_conversion *local_88;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  Vector<const_char> right_trimmed;
  undefined1 auStack_48 [8];
  Vector<const_char> left_trimmed;
  Vector<const_char> *trimmed_local;
  int space_size_local;
  char *buffer_copy_space_local;
  int exponent_local;
  Vector<const_char> buffer_local;
  
  VVar3._8_8_ = buffer._8_8_;
  left_trimmed._12_4_ = in_register_0000008c;
  left_trimmed.length_ = space_size;
  VVar3.start_ = (char *)(ulong)(uint)buffer.start_;
  VVar3 = TrimLeadingZeros(this,VVar3);
  buffer_00._8_8_ = VVar3._8_8_;
  local_88 = (double_conversion *)VVar3.start_;
  left_trimmed.start_._0_4_ = VVar3.length_;
  uStack_80 = CONCAT44(left_trimmed.start_._4_4_,(uint)left_trimmed.start_);
  buffer_00.start_ = (char *)(ulong)(uint)left_trimmed.start_;
  right_trimmed._8_8_ = local_88;
  auStack_48 = (undefined1  [8])local_88;
  VVar3 = TrimTrailingZeros(local_88,buffer_00);
  local_98 = (double_conversion *)VVar3.start_;
  local_90 = VVar3.length_;
  local_78 = (undefined1  [8])local_98;
  right_trimmed.start_._0_4_ = local_90;
  iVar1 = Vector<const_char>::length((Vector<const_char> *)auStack_48);
  iVar2 = Vector<const_char>::length((Vector<const_char> *)local_78);
  iVar1 = (iVar1 - iVar2) + buffer.length_;
  iVar2 = Vector<const_char>::length((Vector<const_char> *)local_78);
  if (iVar2 < 0x30d) {
    *(undefined1 (*) [8])left_trimmed._8_8_ = local_78;
    *(uint *)(left_trimmed._8_8_ + 8) = (uint)right_trimmed.start_;
    *(int *)&trimmed->start_ = iVar1;
  }
  else {
    if ((int)buffer_copy_space < 0x30c) {
      __assert_fail("space_size >= kMaxSignificantDecimalDigits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0x8d,
                    "void FIX::double_conversion::TrimAndCut(Vector<const char>, int, char *, int, Vector<const char> *, int *)"
                   );
    }
    local_a8 = (double_conversion *)local_78;
    local_a0 = CONCAT44(right_trimmed.start_._4_4_,(uint)right_trimmed.start_);
    buffer_01.length_ = iVar1;
    buffer_01.start_ = (char *)(ulong)(uint)right_trimmed.start_;
    buffer_01._12_4_ = 0;
    CutToMaxSignificantDigits
              ((double_conversion *)local_78,buffer_01,exponent,(char *)trimmed,
               (int *)CONCAT44(in_register_0000008c,space_size));
    Vector<const_char>::Vector(&local_b8,(char *)CONCAT44(in_register_0000000c,exponent),0x30c);
    *(char **)left_trimmed._8_8_ = local_b8.start_;
    *(int *)(left_trimmed._8_8_ + 8) = local_b8.length_;
  }
  return;
}

Assistant:

static void TrimAndCut(Vector<const char> buffer, int exponent,
                       char* buffer_copy_space, int space_size,
                       Vector<const char>* trimmed, int* updated_exponent) {
  Vector<const char> left_trimmed = TrimLeadingZeros(buffer);
  Vector<const char> right_trimmed = TrimTrailingZeros(left_trimmed);
  exponent += left_trimmed.length() - right_trimmed.length();
  if (right_trimmed.length() > kMaxSignificantDecimalDigits) {
    (void) space_size;  // Mark variable as used.
    ASSERT(space_size >= kMaxSignificantDecimalDigits);
    CutToMaxSignificantDigits(right_trimmed, exponent,
                              buffer_copy_space, updated_exponent);
    *trimmed = Vector<const char>(buffer_copy_space,
                                 kMaxSignificantDecimalDigits);
  } else {
    *trimmed = right_trimmed;
    *updated_exponent = exponent;
  }
}